

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtablethandler.cpp
# Opt level: O2

void __thiscall QEvdevTabletHandler::~QEvdevTabletHandler(QEvdevTabletHandler *this)

{
  QEvdevTabletData *pQVar1;
  
  *(undefined ***)this = &PTR_metaObject_0010f600;
  if (-1 < this->m_fd) {
    qt_safe_close(this->m_fd);
  }
  pQVar1 = this->d;
  if (pQVar1 != (QEvdevTabletData *)0x0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&(pQVar1->devName).d);
  }
  operator_delete(pQVar1,0x78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_device).d);
  QObject::~QObject(&this->super_QObject);
  return;
}

Assistant:

QEvdevTabletHandler::~QEvdevTabletHandler()
{
    if (m_fd >= 0)
        QT_CLOSE(m_fd);

    delete d;
}